

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O2

void __thiscall TPZCircBufferedStream::Print(TPZCircBufferedStream *this)

{
  uint uVar1;
  ostream *poVar2;
  void *pvVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"fSize=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  pvVar3 = operator_new__(this->fSize & 0xfffffffffffffff8);
  (*(this->super_TPZStream)._vptr_TPZStream[0x39])(this,pvVar3,&this->fSize);
  for (uVar1 = 0; (ulong)uVar1 < this->fSize >> 3; uVar1 = uVar1 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)pvVar3 + (ulong)uVar1 * 8));
    std::operator<<(poVar2," ");
  }
  operator_delete__(pvVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void TPZCircBufferedStream::Print() {
    std::cout << "fSize=" << fSize << std::endl;
    double *temp = new double[fSize / 8];
    ConstRead(reinterpret_cast<char *>(temp), fSize);
    for (unsigned int i = 0; i < fSize / 8; ++i) {
        std::cout << temp[i] << " ";
    }
	delete[] temp;
    std::cout << std::endl;
}